

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delimited_message_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::DelimitedMessageUtilTest_FailsAtEndOfStream_Test::TestBody
          (DelimitedMessageUtilTest_FailsAtEndOfStream_Test *this)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  char *in_R9;
  ostream *local_528;
  string local_520;
  AssertHelper local_500;
  Message local_4f8;
  bool local_4e9;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_4b8;
  Message local_4b0;
  bool local_4a1;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar__1;
  ForeignMessage message_1;
  IstreamInputStream zstream;
  bool clean_eof;
  Message local_410;
  int local_404;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_3e8;
  Message local_3e0;
  unsigned_long local_3d8;
  unsigned_long local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar;
  string full_output;
  AssertHelper local_378;
  Message local_370;
  bool local_361;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_;
  ForeignMessage message;
  stringstream local_320 [8];
  stringstream partial_stream;
  ostream local_310 [376];
  stringstream local_198 [8];
  stringstream full_stream;
  ostream aoStack_188 [376];
  DelimitedMessageUtilTest_FailsAtEndOfStream_Test *local_10;
  DelimitedMessageUtilTest_FailsAtEndOfStream_Test *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  std::__cxx11::stringstream::stringstream(local_320);
  proto2_unittest::ForeignMessage::ForeignMessage((ForeignMessage *)&gtest_ar_.message_);
  proto2_unittest::ForeignMessage::set_c((ForeignMessage *)&gtest_ar_.message_,0x2a);
  proto2_unittest::ForeignMessage::set_d((ForeignMessage *)&gtest_ar_.message_,0x18);
  local_528 = (ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x198) {
    local_528 = aoStack_188;
  }
  local_361 = SerializeDelimitedToOstream((MessageLite *)&gtest_ar_.message_,local_528);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_360,&local_361,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&full_output.field_2 + 8),(internal *)local_360,
               (AssertionResult *)"SerializeDelimitedToOstream(message, &full_stream)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/delimited_message_util_test.cc"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=(&local_378,&local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    std::__cxx11::string::~string((string *)(full_output.field_2._M_local_buf + 8));
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  std::__cxx11::stringstream::str();
  local_3d0 = std::__cxx11::string::size();
  local_3d8 = 2;
  testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
            ((internal *)local_3c8,"full_output.size()","size_t{2}",&local_3d0,&local_3d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/delimited_message_util_test.cc"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    testing::Message::~Message(&local_3e0);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&gtest_ar.message_);
    local_404 = 4;
    testing::internal::EqHelper::Compare<char,_int,_nullptr>
              ((EqHelper *)local_400,"full_output[0]","4",pcVar2,&local_404);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
    if (!bVar1) {
      testing::Message::Message(&local_410);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffbe8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/delimited_message_util_test.cc"
                 ,0x4b,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffbe8,&local_410);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbe8);
      testing::Message::~Message(&local_410);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&gtest_ar.message_);
      poVar3 = std::operator<<(local_310,*pcVar2);
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&gtest_ar.message_);
      poVar3 = std::operator<<(poVar3,*pcVar2);
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&gtest_ar.message_);
      std::operator<<(poVar3,*pcVar2);
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  proto2_unittest::ForeignMessage::~ForeignMessage((ForeignMessage *)&gtest_ar_.message_);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    protobuf::io::IstreamInputStream::IstreamInputStream
              ((IstreamInputStream *)((long)&message_1.field_0 + 8),(istream *)local_320,-1);
    proto2_unittest::ForeignMessage::ForeignMessage((ForeignMessage *)&gtest_ar__1.message_);
    zstream.impl_._55_1_ = 1;
    bVar1 = ParseDelimitedFromZeroCopyStream
                      ((MessageLite *)&gtest_ar__1.message_,
                       (ZeroCopyInputStream *)((long)&message_1.field_0 + 8),
                       (bool *)&zstream.impl_.field_0x37);
    local_4a1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_4a0,&local_4a1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
    if (!bVar1) {
      testing::Message::Message(&local_4b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_4a0,
                 (AssertionResult *)
                 "ParseDelimitedFromZeroCopyStream(&message, &zstream, &clean_eof)","true","false",
                 in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_4b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/delimited_message_util_test.cc"
                 ,0x57,pcVar2);
      testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
      testing::internal::AssertHelper::~AssertHelper(&local_4b8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_4b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
    local_4e9 = (bool)(~zstream.impl_._55_1_ & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_4e8,&local_4e9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
    if (!bVar1) {
      testing::Message::Message(&local_4f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_520,(internal *)local_4e8,(AssertionResult *)"clean_eof","true","false",
                 in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_500,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/delimited_message_util_test.cc"
                 ,0x58,pcVar2);
      testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
      testing::internal::AssertHelper::~AssertHelper(&local_500);
      std::__cxx11::string::~string((string *)&local_520);
      testing::Message::~Message(&local_4f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
    proto2_unittest::ForeignMessage::~ForeignMessage((ForeignMessage *)&gtest_ar__1.message_);
    protobuf::io::IstreamInputStream::~IstreamInputStream
              ((IstreamInputStream *)((long)&message_1.field_0 + 8));
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  std::__cxx11::stringstream::~stringstream(local_320);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

TEST(DelimitedMessageUtilTest, FailsAtEndOfStream) {
  std::stringstream full_stream;
  std::stringstream partial_stream;

  {
    proto2_unittest::ForeignMessage message;
    message.set_c(42);
    message.set_d(24);
    EXPECT_TRUE(SerializeDelimitedToOstream(message, &full_stream));

    std::string full_output = full_stream.str();
    ASSERT_GT(full_output.size(), size_t{2});
    ASSERT_EQ(full_output[0], 4);

    partial_stream << full_output[0] << full_output[1] << full_output[2];
  }

  {
    bool clean_eof;
    io::IstreamInputStream zstream(&partial_stream);

    proto2_unittest::ForeignMessage message;
    clean_eof = true;
    EXPECT_FALSE(ParseDelimitedFromZeroCopyStream(&message,
        &zstream, &clean_eof));
    EXPECT_FALSE(clean_eof);
  }
}